

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O3

void __thiscall TTD::ThreadContextTTD::CleanRecordWeakRootMap(ThreadContextTTD *this)

{
  int iVar1;
  WeakRefDictionaryEntry<Js::RecyclableObject,_bool> *pWVar2;
  int iVar3;
  WeaklyReferencedKeyDictionary<Js::RecyclableObject,_bool,_RecyclerPointerComparer<const_Js::RecyclableObject_*>,_true>
  *this_00;
  int i;
  int nextIndex;
  long lVar4;
  int iVar5;
  
  this_00 = Memory::
            RecyclerRootPtr<JsUtil::WeaklyReferencedKeyDictionary<Js::RecyclableObject,_bool,_RecyclerPointerComparer<const_Js::RecyclableObject_*>,_true>_>
            ::operator->(&this->m_ttdRecordRootWeakMap);
  iVar3 = this_00->size;
  if (0 < iVar3) {
    lVar4 = 0;
    do {
      i = (this_00->buckets).ptr[lVar4];
      if (i != -1) {
        iVar3 = -1;
        do {
          pWVar2 = (this_00->entries).ptr;
          iVar1 = pWVar2[i].next;
          iVar5 = i;
          if (((pWVar2[i].key.ptr)->super_RecyclerWeakReferenceBase).strongRef == (Type)0x0) {
            JsUtil::
            WeaklyReferencedKeyDictionary<Js::RecyclableObject,_bool,_RecyclerPointerComparer<const_Js::RecyclableObject_*>,_true>
            ::RemoveEntry(this_00,i,iVar3,(uint)lVar4);
            iVar5 = iVar3;
          }
          i = iVar1;
          iVar3 = iVar5;
        } while (iVar1 != -1);
        iVar3 = this_00->size;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar3);
  }
  return;
}

Assistant:

void ThreadContextTTD::CleanRecordWeakRootMap()
    {
        this->m_ttdRecordRootWeakMap->Map([&](Js::RecyclableObject* key, bool, const RecyclerWeakReference<Js::RecyclableObject>*)
        {
            ; //nop just map to force the clean
        });
    }